

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

void enet_peer_timeout(ENetPeer *peer,enet_uint32 timeoutLimit,enet_uint32 timeoutMinimum,
                      enet_uint32 timeoutMaximum)

{
  enet_uint32 eVar1;
  
  eVar1 = 0x20;
  if (timeoutLimit != 0) {
    eVar1 = timeoutLimit;
  }
  peer->timeoutLimit = eVar1;
  eVar1 = 5000;
  if (timeoutMinimum != 0) {
    eVar1 = timeoutMinimum;
  }
  peer->timeoutMinimum = eVar1;
  eVar1 = 30000;
  if (timeoutMaximum != 0) {
    eVar1 = timeoutMaximum;
  }
  peer->timeoutMaximum = eVar1;
  return;
}

Assistant:

void enet_peer_timeout(ENetPeer *peer, enet_uint32 timeoutLimit, enet_uint32 timeoutMinimum, enet_uint32 timeoutMaximum) {
        peer->timeoutLimit   = timeoutLimit ? timeoutLimit : (enet_uint32)ENET_PEER_TIMEOUT_LIMIT;
        peer->timeoutMinimum = timeoutMinimum ? timeoutMinimum : (enet_uint32)ENET_PEER_TIMEOUT_MINIMUM;
        peer->timeoutMaximum = timeoutMaximum ? timeoutMaximum : (enet_uint32)ENET_PEER_TIMEOUT_MAXIMUM;
    }